

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleGlyphsDrawingContext.cpp
# Opt level: O0

void __thiscall
SimpleGlyphsDrawingContext::Flush(SimpleGlyphsDrawingContext *this,bool inComputeAdvance)

{
  bool bVar1;
  size_type sVar2;
  pointer pGVar3;
  PDFUsedFont *this_00;
  double dVar4;
  uint local_44;
  _Self local_40;
  _Self local_38;
  iterator it;
  UIntList glyphs;
  bool inComputeAdvance_local;
  SimpleGlyphsDrawingContext *this_local;
  
  sVar2 = std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>::size
                    (&this->mText);
  if (sVar2 == 0) {
    if (inComputeAdvance) {
      this->mLatestAdvance = 0.0;
    }
  }
  else {
    AbstractContentContext::SetupColor(this->mContentContext,&this->mOptions);
    AbstractContentContext::BT(this->mContentContext);
    AbstractContentContext::Tm(this->mContentContext,1.0,0.0,0.0,1.0,this->mX,this->mY);
    AbstractContentContext::SetCurrentFontSize(this->mContentContext,(this->mOptions).fontSize);
    AbstractContentContext::Tj(this->mContentContext,&this->mText);
    AbstractContentContext::ET(this->mContentContext);
    if (inComputeAdvance) {
      std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::list
                ((list<unsigned_int,_std::allocator<unsigned_int>_> *)&it);
      local_38._M_node =
           (_List_node_base *)
           std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>::begin
                     (&this->mText);
      while( true ) {
        local_40._M_node =
             (_List_node_base *)
             std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>::end
                       (&this->mText);
        bVar1 = std::operator!=(&local_38,&local_40);
        if (!bVar1) break;
        pGVar3 = std::_List_iterator<GlyphUnicodeMapping>::operator->(&local_38);
        local_44 = (uint)pGVar3->mGlyphCode;
        std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((list<unsigned_int,_std::allocator<unsigned_int>_> *)&it,&local_44);
        std::_List_iterator<GlyphUnicodeMapping>::operator++(&local_38);
      }
      this_00 = AbstractContentContext::GetCurrentFont(this->mContentContext);
      dVar4 = PDFUsedFont::CalculateTextAdvance(this_00,(UIntList *)&it,(this->mOptions).fontSize);
      this->mLatestAdvance = dVar4;
      std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::~list
                ((list<unsigned_int,_std::allocator<unsigned_int>_> *)&it);
    }
    std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>::clear
              (&this->mText);
  }
  return;
}

Assistant:

void SimpleGlyphsDrawingContext::Flush(bool inComputeAdvance) {
	// current font is expected to have been set in advance, so don't bother with it, and can
	// grab current font

	if(mText.size() == 0) {
		if(inComputeAdvance) {
			mLatestAdvance = 0;
		}
		return;
	}

    mContentContext->SetupColor(mOptions);
	mContentContext->BT();
	mContentContext->Tm(1,0,0,1,mX,mY);
	mContentContext->SetCurrentFontSize(mOptions.fontSize);
	mContentContext->Tj(mText);
	mContentContext->ET();	

	if(inComputeAdvance) {
		UIntList glyphs;

		GlyphUnicodeMappingList::iterator it = mText.begin();
		for(;it!=mText.end(); ++it) {
			glyphs.push_back(it->mGlyphCode);
		}
		
		mLatestAdvance = mContentContext->GetCurrentFont()->CalculateTextAdvance(glyphs, mOptions.fontSize);
	}

	mText.clear();
}